

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmUnpkDn<(moira::Instr)175,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  uint in_EAX;
  Imu<4> im;
  StrWriter *this_00;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  im.raw = dasmIncRead<2>(this,addr);
  SVar1 = str->style->syntax;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Dn)(op & 7));
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00,(Dn)((op & 0xe00) >> 9));
  StrWriter::operator<<(this_00);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    StrWriter::operator<<(this_00,(Ims<2>)im.raw);
    return;
  }
  StrWriter::operator<<(this_00,im);
  uStack_38 = (ulong)(uint)uStack_38;
  StrWriter::operator<<(str,(Av<(moira::Instr)175,_(moira::Mode)0,_2> *)((long)&uStack_38 + 4));
  return;
}

Assistant:

void
Moira::dasmUnpkDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead <Word> (addr);
    auto rx = Op <M,S> ( _____________xxx(op), addr );
    auto ry = Op <M,S> ( ____xxx_________(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Ims<S>(ext);
            break;

        default:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Imu(ext);
            str << Av<I, M, S>{};
    }
}